

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameQuotefixFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  sqlite3 *db_00;
  uchar *puVar3;
  Walker *pWalker;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  int i;
  Select *pSelect;
  int rc;
  sqlite3_xauth xAuth;
  char *zInput;
  char *zDb;
  sqlite3 *db;
  Walker sWalker;
  RenameCtx sCtx;
  Parse sParse;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdb4;
  sqlite3 *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 uVar4;
  Parse *p;
  undefined1 *local_200;
  undefined8 uVar5;
  code *zNew;
  char *in_stack_fffffffffffffe18;
  RenameCtx *in_stack_fffffffffffffe20;
  sqlite3_context *pCtx;
  Parse *pParse;
  undefined1 local_1b0 [24];
  int local_198;
  Table *local_50;
  long local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = sqlite3_context_db_handle(in_RDI);
  puVar3 = sqlite3_value_text((sqlite3_value *)0x228bb6);
  pWalker = (Walker *)sqlite3_value_text((sqlite3_value *)0x228bc9);
  p = (Parse *)db_00->xAuth;
  db_00->xAuth = (sqlite3_xauth)0x0;
  sqlite3BtreeEnterAll((sqlite3 *)0x228bf9);
  if ((puVar3 != (uchar *)0x0) && (pWalker != (Walker *)0x0)) {
    uVar4 = 0xaaaaaaaa;
    memset(local_1b0,0xaa,0x1a8);
    iVar1 = renameParseSql(p,(char *)CONCAT44(uVar4,in_stack_fffffffffffffdc0),
                           in_stack_fffffffffffffdb8,
                           (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           in_stack_fffffffffffffdac);
    if (iVar1 == 0) {
      pParse = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
      memset(&local_200,0xaa,0x30);
      memset(&stack0xfffffffffffffe30,0,0x20);
      memset(&local_200,0,0x30);
      local_200 = local_1b0;
      uVar5 = 0;
      iVar2 = 0;
      zNew = renameColumnSelectCb;
      pCtx = (sqlite3_context *)&stack0xfffffffffffffe30;
      if (local_50 == (Table *)0x0) {
        if (local_48 == 0) {
          iVar2 = 0;
          iVar1 = renameResolveTrigger(pParse);
          if (iVar1 == 0) {
            renameWalkTrigger(pWalker,(Trigger *)p);
          }
        }
        else {
          sqlite3WalkExprList((Walker *)in_stack_fffffffffffffdb8,
                              (ExprList *)
                              CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
          sqlite3WalkExpr((Walker *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                          (Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        }
      }
      else if (local_50->eTabType == '\x02') {
        in_stack_fffffffffffffdb8 = *(sqlite3 **)&local_50->u;
        *(uint *)((long)&in_stack_fffffffffffffdb8->pVfs + 4) =
             *(uint *)((long)&in_stack_fffffffffffffdb8->pVfs + 4) & 0xffdfffff;
        local_198 = 0;
        iVar2 = 0;
        sqlite3SelectPrep((Parse *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                          (Select *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                          (NameContext *)0x228d6f);
        in_stack_fffffffffffffdb0 = local_198;
        if (db_00->mallocFailed != '\0') {
          in_stack_fffffffffffffdb0 = 7;
        }
        iVar1 = in_stack_fffffffffffffdb0;
        if (in_stack_fffffffffffffdb0 == 0) {
          sqlite3WalkSelect((Walker *)in_stack_fffffffffffffdb8,
                            (Select *)((ulong)in_stack_fffffffffffffdb4 << 0x20));
        }
      }
      else {
        sqlite3WalkExprList((Walker *)in_stack_fffffffffffffdb8,
                            (ExprList *)CONCAT44(0xaaaaaaaa,in_stack_fffffffffffffdb0));
        for (in_stack_fffffffffffffdb4 = 0; iVar2 = (int)((ulong)uVar5 >> 0x20),
            (int)in_stack_fffffffffffffdb4 < (int)local_50->nCol;
            in_stack_fffffffffffffdb4 = in_stack_fffffffffffffdb4 + 1) {
          sqlite3ColumnExpr(local_50,local_50->aCol + (int)in_stack_fffffffffffffdb4);
          sqlite3WalkExpr((Walker *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                          (Expr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        }
      }
      if (iVar1 == 0) {
        iVar1 = renameEditSql(pCtx,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(char *)zNew,
                              iVar2);
      }
      renameTokenFree((sqlite3 *)CONCAT44(iVar1,in_stack_fffffffffffffdc0),
                      (RenameToken *)in_stack_fffffffffffffdb8);
    }
    if (iVar1 != 0) {
      iVar2 = sqlite3WritableSchema(db_00);
      if ((iVar2 == 0) || (iVar1 != 1)) {
        sqlite3_result_error_code
                  ((sqlite3_context *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   in_stack_fffffffffffffdac);
      }
      else {
        sqlite3_result_value
                  ((sqlite3_context *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (sqlite3_value *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      }
    }
    renameParseCleanup((Parse *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  }
  db_00->xAuth = (sqlite3_xauth)p;
  sqlite3BtreeLeaveAll((sqlite3 *)0x228f3c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void renameQuotefixFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  sqlite3BtreeEnterAll(db);

  UNUSED_PARAMETER(NotUsed);
  if( zDb && zInput ){
    int rc;
    Parse sParse;
    rc = renameParseSql(&sParse, zDb, db, zInput, 0);

    if( rc==SQLITE_OK ){
      RenameCtx sCtx;
      Walker sWalker;

      /* Walker to find tokens that need to be replaced. */
      memset(&sCtx, 0, sizeof(RenameCtx));
      memset(&sWalker, 0, sizeof(Walker));
      sWalker.pParse = &sParse;
      sWalker.xExprCallback = renameQuotefixExprCb;
      sWalker.xSelectCallback = renameColumnSelectCb;
      sWalker.u.pRename = &sCtx;

      if( sParse.pNewTable ){
        if( IsView(sParse.pNewTable) ){
          Select *pSelect = sParse.pNewTable->u.view.pSelect;
          pSelect->selFlags &= ~SF_View;
          sParse.rc = SQLITE_OK;
          sqlite3SelectPrep(&sParse, pSelect, 0);
          rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
          if( rc==SQLITE_OK ){
            sqlite3WalkSelect(&sWalker, pSelect);
          }
        }else{
          int i;
          sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
          for(i=0; i<sParse.pNewTable->nCol; i++){
            sqlite3WalkExpr(&sWalker,
               sqlite3ColumnExpr(sParse.pNewTable,
                                         &sParse.pNewTable->aCol[i]));
          }
#endif /* SQLITE_OMIT_GENERATED_COLUMNS */
        }
      }else if( sParse.pNewIndex ){
        sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
        sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
      }else{
#ifndef SQLITE_OMIT_TRIGGER
        rc = renameResolveTrigger(&sParse);
        if( rc==SQLITE_OK ){
          renameWalkTrigger(&sWalker, sParse.pNewTrigger);
        }
#endif /* SQLITE_OMIT_TRIGGER */
      }

      if( rc==SQLITE_OK ){
        rc = renameEditSql(context, &sCtx, zInput, 0, 0);
      }
      renameTokenFree(db, sCtx.pList);
    }
    if( rc!=SQLITE_OK ){
      if( sqlite3WritableSchema(db) && rc==SQLITE_ERROR ){
        sqlite3_result_value(context, argv[1]);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif

  sqlite3BtreeLeaveAll(db);
}